

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcList_item *p)

{
  sqlite3 *db;
  int iVar1;
  Db *pDVar2;
  Table *pTVar3;
  
  if (p->pSchema == (Schema *)0x0) {
    pDVar2 = (Db *)&p->zDatabase;
  }
  else {
    db = pParse->db;
    iVar1 = sqlite3SchemaToIndex(db,p->pSchema);
    pDVar2 = db->aDb + iVar1;
  }
  pTVar3 = sqlite3LocateTable(pParse,flags,p->zName,pDVar2->zDbSName);
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse, 
  u32 flags,
  struct SrcList_item *p
){
  const char *zDb;
  assert( p->pSchema==0 || p->zDatabase==0 );
  if( p->pSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    zDb = p->zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}